

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

TileBufferTask_conflict *
Imf_2_5::anon_unknown_8::newTileBufferTask
          (TaskGroup *group,Data *ifd,int number,int dx,int dy,int lx,int ly)

{
  TileBuffer *this;
  TileBufferTask_conflict *pTVar1;
  undefined4 in_ECX;
  uint in_EDX;
  void *__stat_loc;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  TileBuffer *tileBuffer;
  int in_stack_00000378;
  int in_stack_0000037c;
  int in_stack_00000380;
  int in_stack_00000384;
  Data *in_stack_00000388;
  InputStreamMutex *in_stack_00000390;
  char **in_stack_000003a0;
  Int64 *in_stack_000003a8;
  Int64 *in_stack_000003b0;
  TileBuffer *tileBuffer_00;
  Data *ifd_00;
  undefined8 in_stack_ffffffffffffffa8;
  TaskGroup *group_00;
  Data *in_stack_ffffffffffffffb0;
  
  __stat_loc = (void *)(ulong)in_EDX;
  this = DeepTiledInputFile::Data::getTileBuffer
                   (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  TileBuffer::wait(this,__stat_loc);
  *(undefined4 *)((long)&(this->exception)._M_string_length + 4) = in_ECX;
  *(undefined4 *)&(this->exception).field_2 = in_R8D;
  *(undefined4 *)((long)&(this->exception).field_2 + 4) = in_R9D;
  *(undefined4 *)((long)&(this->exception).field_2 + 8) = in_stack_00000008;
  this->compressor = (Compressor *)0x0;
  tileBuffer_00 = (TileBuffer *)&this->format;
  ifd_00 = (Data *)&this->dy;
  group_00 = (TaskGroup *)&this->ly;
  readTileData(in_stack_00000390,in_stack_00000388,in_stack_00000384,in_stack_00000380,
               in_stack_0000037c,in_stack_00000378,in_stack_000003a0,in_stack_000003a8,
               in_stack_000003b0);
  pTVar1 = (TileBufferTask_conflict *)operator_new(0x20);
  TileBufferTask::TileBufferTask
            ((TileBufferTask_conflict *)in_stack_ffffffffffffffb0,group_00,ifd_00,tileBuffer_00);
  return pTVar1;
}

Assistant:

TileBufferTask *
newTileBufferTask
    (TaskGroup *group,
     DeepTiledInputFile::Data *ifd,
     int number,
     int dx, int dy,
     int lx, int ly)
{
    //
    // Wait for a tile buffer to become available,
    // fill the buffer with raw data from the file,
    // and create a new TileBufferTask whose execute()
    // method will uncompress the tile and copy the
    // tile's pixels into the frame buffer.
    //

    TileBuffer *tileBuffer = ifd->getTileBuffer (number);

    try
    {
        tileBuffer->wait();

        tileBuffer->dx = dx;
        tileBuffer->dy = dy;
        tileBuffer->lx = lx;
        tileBuffer->ly = ly;

        tileBuffer->uncompressedData = 0;

        readTileData (ifd->_streamData, ifd, dx, dy, lx, ly,
                      tileBuffer->buffer,
                      tileBuffer->dataSize,
                      tileBuffer->uncompressedDataSize);
    }
    catch (...)
    {
        //
        // Reading from the file caused an exception.
        // Signal that the tile buffer is free, and
        // re-throw the exception.
        //

        tileBuffer->post();
        throw;
    }

    return new TileBufferTask (group, ifd, tileBuffer);
}